

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_index_info.cpp
# Opt level: O3

string * __thiscall
duckdb::CreateIndexInfo::ExpressionsToString_abi_cxx11_
          (string *__return_storage_ptr__,CreateIndexInfo *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true> list
  ;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  vStack_48;
  string local_30;
  
  ExpressionsToList_abi_cxx11_(&vStack_48,this);
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,", ","");
  StringUtil::Join(__return_storage_ptr__,&vStack_48,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&vStack_48);
  return __return_storage_ptr__;
}

Assistant:

string CreateIndexInfo::ExpressionsToString() const {
	auto list = ExpressionsToList();
	return StringUtil::Join(list, ", ");
}